

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

FileContainer_ptr __thiscall
filesystemcollection::getbyname(filesystemcollection *this,string *name)

{
  _Base_ptr p_Var1;
  undefined4 uVar2;
  iterator iVar3;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  FileContainer_ptr FVar4;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>_>
                  *)name,in_RDX);
  if (iVar3._M_node == (_Base_ptr)&name->_M_string_length) {
    *(undefined8 *)&(this->_byname)._M_t._M_impl = 0;
    *(undefined8 *)&(this->_byname)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  }
  else {
    uVar2 = *(undefined4 *)&iVar3._M_node[2].field_0x4;
    *(_Rb_tree_color *)&(this->_byname)._M_t._M_impl.field_0x0 = iVar3._M_node[2]._M_color;
    *(undefined4 *)&(this->_byname)._M_t._M_impl.field_0x4 = uVar2;
    p_Var1 = iVar3._M_node[2]._M_parent;
    *(_Base_ptr *)&(this->_byname)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var1;
    if (p_Var1 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
      }
    }
  }
  FVar4.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  FVar4.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (FileContainer_ptr)FVar4.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FileContainer_ptr getbyname(const std::string& name)
    {
        auto i= _byname.find(name);
        if (i==_byname.end())
            return FileContainer_ptr();
        return i->second;
    }